

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_valueOptNotEmptyGreater_Test::optCompare_valueOptNotEmptyGreater_Test
          (optCompare_valueOptNotEmptyGreater_Test *this)

{
  optCompare_valueOptNotEmptyGreater_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__optCompare_valueOptNotEmptyGreater_Test_0025c3c8;
  return;
}

Assistant:

TEST(optCompare, valueOptNotEmptyGreater)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_FALSE(2 == i);
  EXPECT_TRUE(2 != i);
  EXPECT_FALSE(2 < i);
  EXPECT_TRUE(2 > i);
  EXPECT_FALSE(2 <= i);
  EXPECT_TRUE(2 >= i);
}